

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O0

vector<duckdb::LogicalType,_true> * __thiscall duckdb::CSVSchema::GetTypes(CSVSchema *this)

{
  bool bVar1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RSI;
  value_type *in_RDI;
  CSVColumnInfo *column;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::CSVColumnInfo,_true> *__range1;
  vector<duckdb::LogicalType,_true> *types;
  vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *in_stack_ffffffffffffff98;
  value_type *__x;
  __normal_iterator<const_duckdb::CSVColumnInfo_*,_std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1adc34f);
  local_28[0]._M_current =
       (CSVColumnInfo *)
       ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::begin
                 (in_stack_ffffffffffffff98);
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::end
            (in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::CSVColumnInfo_*,_std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_duckdb::CSVColumnInfo_*,_std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_duckdb::CSVColumnInfo_*,_std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>_>
    ::operator*(local_28);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back(in_RSI,__x);
    __gnu_cxx::
    __normal_iterator<const_duckdb::CSVColumnInfo_*,_std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>_>
    ::operator++(local_28);
  }
  return (vector<duckdb::LogicalType,_true> *)__x;
}

Assistant:

vector<LogicalType> CSVSchema::GetTypes() const {
	vector<LogicalType> types;
	for (auto &column : columns) {
		types.push_back(column.type);
	}
	return types;
}